

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::IsValid(ON_PolyCurve *this,bool bAllowGaps,ON_TextLog *text_log)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ON_Curve **ppOVar6;
  double *pdVar7;
  double dVar8;
  double d;
  double local_98;
  double local_90;
  ON_3dPoint local_88;
  uint local_6c;
  uint local_68;
  int gap_index;
  int seg_dim;
  int segment_index;
  ON_3dPoint p1;
  ON_3dPoint p0;
  int dim;
  int count;
  ON_TextLog *text_log_local;
  bool bAllowGaps_local;
  ON_PolyCurve *this_local;
  
  uVar2 = Count(this);
  uVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if (((int)uVar2 < 1) || ((int)uVar3 < 1)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"Polycurve segment count = %d and dim = %d\n",(ulong)uVar2,
                        (ulong)uVar3);
    }
    this_local._7_1_ = ON_IsNotValid();
  }
  else {
    iVar4 = ON_SimpleArray<double>::Count(&this->m_t);
    if (iVar4 == uVar2 + 1) {
      for (gap_index = 0; gap_index < (int)uVar2; gap_index = gap_index + 1) {
        ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,gap_index);
        if (*ppOVar6 == (ON_Curve *)0x0) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"Polycurve segment[%d] is null.\n",(ulong)(uint)gap_index);
          }
          bVar1 = ON_IsNotValid();
          return bVar1;
        }
        ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,gap_index);
        uVar5 = (*((*ppOVar6)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])
                          (*ppOVar6,text_log);
        if ((uVar5 & 1) == 0) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"Polycurve segment[%d] is not valid.\n",
                              (ulong)(uint)gap_index);
          }
          bVar1 = ON_IsNotValid();
          return bVar1;
        }
        ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,gap_index);
        local_68 = (*((*ppOVar6)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
        if (local_68 != uVar3) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"Polycurve segment[%d]->Dimension()=%d (should be %d).\n",
                              (ulong)(uint)gap_index,(ulong)local_68,(ulong)uVar3);
          }
          bVar1 = ON_IsNotValid();
          return bVar1;
        }
        pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,gap_index);
        dVar8 = *pdVar7;
        pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,gap_index + 1);
        iVar4 = gap_index;
        if (*pdVar7 <= dVar8) {
          if (text_log != (ON_TextLog *)0x0) {
            pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,gap_index);
            dVar8 = *pdVar7;
            uVar2 = gap_index + 1;
            pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,gap_index + 1);
            ON_TextLog::Print(text_log,
                              "Polycurve m_t[%d]=%g and m_t[%d]=%g (should be increasing)\n",dVar8,
                              *pdVar7,(ulong)(uint)iVar4,(ulong)uVar2);
          }
          bVar1 = ON_IsNotValid();
          return bVar1;
        }
        if ((1 < (int)uVar2) && (!bAllowGaps)) {
          ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,gap_index);
          uVar5 = (*((*ppOVar6)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
          if ((uVar5 & 1) != 0) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"Polycurve segment[%d] is closed (%d segments).\n",
                                (ulong)(uint)gap_index,(ulong)uVar2);
            }
            bVar1 = ON_IsNotValid();
            return bVar1;
          }
        }
      }
      if ((bAllowGaps) || (local_6c = FindNextGap(this,0), (int)local_6c < 1)) {
        this_local._7_1_ = true;
      }
      else {
        ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_6c - 1);
        ON_Curve::PointAtEnd(&local_88,*ppOVar6);
        p1.z = local_88.x;
        ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_6c);
        ON_Curve::PointAtStart((ON_3dPoint *)&d,*ppOVar6);
        _seg_dim = d;
        p1.x = local_98;
        p1.y = local_90;
        dVar8 = ON_3dPoint::DistanceTo((ON_3dPoint *)&p1.z,(ON_3dPoint *)&seg_dim);
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "Polycurve end of segment[%d] != start of segment[%d] (distance=%g)\n",
                            dVar8,(ulong)(local_6c - 1),(ulong)local_6c);
        }
        this_local._7_1_ = ON_IsNotValid();
      }
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        uVar3 = ON_SimpleArray<double>::Count(&this->m_t);
        ON_TextLog::Print(text_log,
                          "Polycurve segment count = %d and m_t.Count()=%d (should be segment count+1)\n"
                          ,(ulong)uVar2,(ulong)uVar3);
      }
      this_local._7_1_ = ON_IsNotValid();
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PolyCurve::IsValid( bool bAllowGaps, ON_TextLog* text_log ) const
{
  const int count = Count();
  const int dim = Dimension();
  ON_3dPoint p0, p1;
  int segment_index;
  if ( count <= 0 || dim <= 0 )
  {
    if ( text_log )
      text_log->Print("Polycurve segment count = %d and dim = %d\n",count,dim);
    return ON_IsNotValid();
  }

  if ( m_t.Count() != count+1 )
  {
    if ( text_log )
      text_log->Print("Polycurve segment count = %d and m_t.Count()=%d (should be segment count+1)\n",
                      count,m_t.Count());
    return ON_IsNotValid();
  }

  for ( segment_index = 0; segment_index < count; segment_index++ ) 
  {
    if ( 0 == m_segment[segment_index] )
    {
      if ( text_log )
      {
        text_log->Print("Polycurve segment[%d] is null.\n",segment_index);
      }
      return ON_IsNotValid();
    }

    if ( !m_segment[segment_index]->IsValid( text_log ) )
    {
      if ( text_log )
      {
        text_log->Print("Polycurve segment[%d] is not valid.\n",segment_index);
      }
      return ON_IsNotValid();
    }

    int seg_dim = m_segment[segment_index]->Dimension();
    if ( seg_dim != dim )
    {
      if ( text_log )
        text_log->Print("Polycurve segment[%d]->Dimension()=%d (should be %d).\n",segment_index,seg_dim,dim);
      return ON_IsNotValid(); // all segments must have same dimension
    }

    if ( m_t[segment_index] >= m_t[segment_index+1] )
    {
      if ( text_log )
        text_log->Print("Polycurve m_t[%d]=%g and m_t[%d]=%g (should be increasing)\n",
                         segment_index,   m_t[segment_index],
                         segment_index+1, m_t[segment_index+1]);
      return ON_IsNotValid(); // segment domain must be non-empty
    }

    if ( count > 1 && !bAllowGaps && m_segment[segment_index]->IsClosed() ) 
    {
      if ( text_log )
        text_log->Print("Polycurve segment[%d] is closed (%d segments).\n",segment_index,count);
      return ON_IsNotValid(); // closed segments not permitted in multi segment curve
    }
  }

  if ( !bAllowGaps )
  {
    // check for gaps
    int gap_index = FindNextGap(0);
    if ( gap_index > 0 )
    {
      p0 = m_segment[gap_index-1]->PointAtEnd();
      p1 = m_segment[gap_index]->PointAtStart();
      double d = p0.DistanceTo(p1);
      if ( text_log )
        text_log->Print("Polycurve end of segment[%d] != start of segment[%d] (distance=%g)\n",
                        gap_index-1, gap_index, d );
      return ON_IsNotValid(); // not contiguous
    }
  }

  return true;
}